

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  uint k;
  CTSize CVar2;
  byte bVar3;
  IRRef1 IVar4;
  ushort uVar5;
  IRType IVar6;
  IRType IVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  TRef TVar11;
  CTypeID CVar12;
  ulong uVar13;
  CType *pCVar14;
  GCcdata *pGVar15;
  IRRef1 IVar16;
  ushort uVar17;
  CType *ct;
  uint uVar18;
  IRRef1 IVar19;
  CTState *pCVar20;
  int32_t iVar21;
  CTInfo CVar23;
  bool bVar24;
  bool bVar25;
  CTSize ofs;
  double *local_40;
  CTSize local_34;
  int32_t iVar22;
  
  pCVar20 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  uVar18 = sp >> 0x18 & 0x1f;
  if (uVar18 - 0xf < 5) {
    local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
    uVar18 = 9;
LAB_0015839c:
    ct = (CType *)((long)&pCVar20->tab->info + (ulong)(uVar18 << 4));
  }
  else {
    uVar10 = sp & 0x1f000000;
    if (uVar10 == 0xe000000) {
      local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
      uVar18 = 0xe;
      goto LAB_0015839c;
    }
    if (uVar18 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar10 == 0x2000000));
      uVar18 = 3;
      local_40 = (double *)0x0;
      goto LAB_0015839c;
    }
    IVar16 = (IRRef1)sp;
    if (0x3ffffff < uVar10) {
      if (uVar10 == 0x4000000) {
        if ((d->info & 0xf0000000) == 0x50000000) {
          uVar18 = (sval->u32).lo;
          local_40 = (double *)0x0;
          pCVar14 = lj_ctype_getfieldq(pCVar20,d,&((GCobj *)(ulong)uVar18)->str,&local_34,
                                       (CTInfo *)0x0);
          TVar9 = lj_ir_kgc(J,(GCobj *)(ulong)uVar18,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          lj_opt_fold(J);
          uVar18 = 0x11;
          if (pCVar14 != (CType *)0x0) {
            if ((pCVar14->info & 0xf0000000) == 0xb0000000) {
              local_40 = (double *)(ulong)(local_34 != 0);
              sp = lj_ir_kint(J,local_34);
              uVar18 = (uint)(ushort)pCVar14->info;
            }
            else {
              local_40 = (double *)0x0;
            }
          }
          goto LAB_0015839c;
        }
        if ((d->info & 0xfc000000) == 0x30000000) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        TVar9 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
        uVar18 = 0x14;
      }
      else {
        if (uVar10 != 0xc000000) goto LAB_00158c5f;
        if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
          (J->fold).ins.field_0.op1 = IVar16;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4410000c;
          TVar9 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,1);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = IVar16;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4409000d;
        }
        else {
          TVar9 = lj_ir_kint64(J,0x18);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        }
        sp = lj_opt_fold(J);
        uVar18 = 0x11;
      }
LAB_00158e51:
      local_40 = (double *)0x0;
      goto LAB_0015839c;
    }
    if (uVar10 == 0) {
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      uVar18 = 0x11;
      goto LAB_00158e51;
    }
    if (uVar10 == 0x3000000) goto switchD_00158464_caseD_3;
LAB_00158c5f:
    pGVar15 = argv2cdata(J,sp,sval);
    uVar1 = pGVar15->ctypeid;
    pCVar14 = pCVar20->tab;
    CVar23 = pCVar14[uVar1].info;
    uVar18 = (sval->u32).lo;
    if ((CVar23 & 0xf0000000) == 0x60000000) {
      CVar12 = lj_ctype_intern(pCVar20,uVar1 | 0x20030000,8);
      pCVar14 = pCVar20->tab;
      ct = pCVar14 + CVar12;
      CVar23 = pCVar14[CVar12].info;
      IVar7 = IRT_P64;
    }
    else {
      ct = pCVar14 + uVar1;
      IVar7 = crec_ct2irt(pCVar20,ct);
    }
    local_40 = (double *)((ulong)uVar18 + 8);
    uVar1 = (ushort)IVar7;
    if (CVar23 >> 0x1c == 2) {
      (J->fold).ins.field_0.ot = uVar1 | 0x4400;
      (J->fold).ins.field_0.op1 = IVar16;
      (J->fold).ins.field_0.op2 = 0xf;
      sp = lj_opt_fold(J);
      if ((ct->info & 0xf0800000) == 0x20800000) {
        local_40 = (double *)*local_40;
        uVar13 = (ulong)((ct->info & 0xffff) << 4);
        uVar18 = *(uint *)((long)&pCVar20->tab->info + uVar13);
        if ((uVar18 & 0xf0000000) == 0x50000000) {
          uVar13 = (ulong)((uVar18 & 0xffff) << 4);
        }
        ct = (CType *)((long)&pCVar20->tab->info + uVar13);
        IVar7 = crec_ct2irt(pCVar20,ct);
LAB_00158f05:
        if ((ct->info < 0x10000000) && (IVar7 != IRT_CDATA)) {
          (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x4500;
          (J->fold).ins.field_0.op1 = (IRRef1)sp;
          (J->fold).ins.field_0.op2 = 0;
          goto LAB_00158f39;
        }
      }
    }
    else {
      if (IVar7 - IRT_I64 < 2) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4400;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0x11;
      }
      else {
        if (1 < IVar7 - IRT_IGC) {
          TVar9 = lj_ir_kint64(J,8);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          sp = lj_opt_fold(J);
          goto LAB_00158f05;
        }
        if (CVar23 >> 0x1c == 5) {
          ct = (CType *)((long)&pCVar14->info + (ulong)((CVar23 & 0xffff) << 4));
        }
        (J->fold).ins.field_0.ot = uVar1 | 0x4400;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0x10;
      }
LAB_00158f39:
      sp = lj_opt_fold(J);
    }
  }
  uVar18 = d->info;
  if ((uVar18 & 0xf0000000) == 0x50000000) {
    uVar13 = (ulong)((uVar18 & 0xffff) << 4);
    d = (CType *)((long)&pCVar20->tab->info + uVar13);
    uVar18 = *(uint *)((long)&pCVar20->tab->info + uVar13);
  }
  pCVar20 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  IVar6 = crec_ct2irt(pCVar20,d);
  IVar7 = crec_ct2irt(pCVar20,ct);
  if ((0x3fffffff < uVar18) || (uVar10 = ct->info, 0x3fffffff < uVar10))
  goto switchD_00158464_caseD_3;
  k = d->size;
  bVar3 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar10 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar18 >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar3) {
    if (bVar3 != 0x3f) goto switchD_00158464_caseD_3;
switchD_00158464_caseD_36:
    if (dp == 0) goto switchD_00158464_caseD_3;
    TVar9 = lj_ir_kint(J,k);
    crec_copy(J,dp,sp,TVar9,d);
    goto LAB_00158957;
  }
  uVar18 = ct->size;
  IVar19 = (IRRef1)sp;
  uVar17 = (ushort)IVar7;
  IVar16 = (IRRef1)dp;
  uVar1 = (ushort)IVar6;
  switch(bVar3) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar7 == IRT_CDATA) goto switchD_00158464_caseD_3;
    if (IVar7 - IRT_FLOAT < 2) {
      TVar9 = lj_ir_knum_u64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else if (IVar7 - IRT_I64 < 2) {
      TVar9 = lj_ir_kint64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else {
      TVar9 = lj_ir_kint(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    uVar5 = 0x800;
    iVar21 = 0;
    iVar22 = 0;
    if (local_40 == (double *)0x0) goto LAB_00158a14;
    if (local_40 == (double *)0x1) {
LAB_00158a09:
      uVar5 = 0x900;
      iVar22 = 1;
    }
    else {
      CVar2 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar2 == 4) {
          if (*(float *)local_40 != 0.0) goto LAB_00158a09;
        }
        else {
          iVar22 = iVar21;
          if (CVar2 == 2) {
            if (*(short *)local_40 != 0) goto LAB_00158a09;
          }
          else if (CVar2 == 1) {
            if (*(char *)local_40 != '\0') goto LAB_00158a09;
          }
          else if (*local_40 != 0.0) goto LAB_00158a09;
        }
      }
      else {
        if (CVar2 == 4) {
          bVar24 = NAN(*(float *)local_40);
          bVar25 = *(float *)local_40 == 0.0;
        }
        else {
          bVar24 = NAN(*local_40);
          bVar25 = *local_40 == 0.0;
        }
        if ((!bVar25) || (bVar24)) goto LAB_00158a09;
      }
    }
LAB_00158a14:
    (J->fold).ins.field_0.ot = uVar5 | uVar17 | 0x80;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,iVar22);
    break;
  default:
    goto switchD_00158464_caseD_3;
  case 8:
  case 9:
switchD_00158464_caseD_8:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00158464_caseD_3;
    if ((k == 8) && ((uVar18 < 8 && ((uVar10 & 0x800000) == 0)))) {
      uVar5 = uVar1 | 0x5900;
      if (uVar18 < 4) {
        IVar7 = IRT_IGC;
      }
      uVar17 = (ushort)(IVar6 << 5) | (ushort)IVar7 | 0x800;
      goto LAB_0015888b;
    }
    if ((7 < k) || (uVar18 != 8)) {
      if (IVar7 == IRT_IGC) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar8 = IRT_IGC;
    if (3 < k) {
      IVar8 = IVar6;
    }
    uVar17 = (ushort)IVar7 | (ushort)(IVar8 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x5900;
    goto LAB_0015890e;
  case 10:
    goto switchD_00158464_caseD_a;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
    goto switchD_00158464_caseD_a;
  case 0xd:
  case 0xe:
    if ((k & 8) == 0) {
      IVar7 = IRT_U64;
      uVar10 = 0x800000;
      uVar18 = 8;
      goto switchD_00158464_caseD_8;
    }
    uVar5 = uVar1 | 0x5900;
    uVar17 = (ushort)(IVar6 << 5) | 9;
    goto LAB_0015888b;
  case 0x10:
  case 0x11:
    goto switchD_00158464_caseD_10;
  case 0x12:
    goto switchD_00158464_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_00158464_caseD_12:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00158464_caseD_3;
    if (IVar6 == IVar7) break;
    uVar17 = uVar17 | (ushort)(IVar6 << 5);
    (J->fold).ins.field_0.ot = uVar1 | 0x5900;
LAB_0015890e:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_0015891d;
  case 0x19:
  case 0x1a:
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    TVar11 = lj_ir_knum_u64(J,0);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    lj_opt_fold(J);
    if ((uVar10 >> 0x1a & 1) != 0) goto switchD_00158464_caseD_12;
switchD_00158464_caseD_10:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00158464_caseD_3;
    uVar5 = uVar1 | 0x5900;
    if (uVar18 < 4) {
      IVar7 = IRT_IGC;
    }
    uVar17 = (ushort)(IVar6 << 5) | (ushort)IVar7;
    goto LAB_0015888b;
  case 0x1b:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00158464_caseD_3;
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar9;
    TVar9 = lj_ir_kint64(J,(ulong)(uVar18 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar19 = (IRRef1)TVar9;
    if (IVar6 != IVar7) {
      uVar17 = uVar17 | (ushort)(IVar6 << 5);
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar4 = (IRRef1)TVar9;
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar19;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar9 = lj_opt_fold(J);
      IVar19 = (IRRef1)TVar9;
    }
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar19;
    goto LAB_00158952;
  case 0x29:
    if (IVar7 == IRT_CDATA) goto switchD_00158464_caseD_3;
    break;
  case 0x2a:
    if (IVar7 == IRT_CDATA) goto switchD_00158464_caseD_3;
    uVar5 = k == 8 | 0x5914;
    uVar17 = (ushort)(k == 8) << 5 | uVar17 | 0x1280;
LAB_0015888b:
    (J->fold).ins.field_0.ot = uVar5;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = uVar17;
LAB_0015891d:
    sp = lj_opt_fold(J);
    break;
  case 0x36:
    goto switchD_00158464_caseD_36;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_00158952:
    lj_opt_fold(J);
LAB_00158957:
    sp = 0;
  }
  return sp;
switchD_00158464_caseD_a:
  if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) {
switchD_00158464_caseD_3:
    lj_trace_err(J,LJ_TRERR_NYICONV);
  }
  IVar7 = IRT_IGC;
  if (3 < k) {
    IVar7 = IVar6;
  }
  (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x5900;
  (J->fold).ins.field_0.op1 = (IRRef1)sp;
  (J->fold).ins.field_0.op2 = (ushort)(IVar7 << 5) | uVar17 | 0x1000;
  goto LAB_0015891d;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}